

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int udp_ep_bind(void *arg,nng_url *url)

{
  nni_mtx *mtx;
  int iVar1;
  uint32_t uVar2;
  undefined1 local_b0 [8];
  nng_sockaddr sa;
  
  mtx = (nni_mtx *)((long)arg + 8);
  nni_mtx_lock(mtx);
  if (*(char *)((long)arg + 0x35) == '\x01') {
    nni_mtx_unlock(mtx);
    iVar1 = 4;
  }
  else {
    iVar1 = nni_plat_udp_open((nni_plat_udp **)arg,(nni_sockaddr *)((long)arg + 0x858));
    if (iVar1 == 0) {
      nni_plat_udp_sockname(*arg,(nng_sockaddr *)local_b0);
      uVar2 = nng_sockaddr_port((nng_sockaddr *)local_b0);
      url->u_port = uVar2;
      *(undefined1 *)((long)arg + 0x35) = 1;
      udp_start_rx((udp_ep *)arg);
      nni_mtx_unlock(mtx);
      iVar1 = 0;
    }
    else {
      nni_mtx_unlock(mtx);
    }
  }
  return iVar1;
}

Assistant:

static int
udp_ep_bind(void *arg, nng_url *url)
{
	udp_ep *ep = arg;
	int     rv;

	nni_mtx_lock(&ep->mtx);
	if (ep->started) {
		nni_mtx_unlock(&ep->mtx);
		return (NNG_EBUSY);
	}

	rv = nni_udp_open(&ep->udp, &ep->self_sa);
	if (rv != 0) {
		nni_mtx_unlock(&ep->mtx);
		return (rv);
	}
	nng_sockaddr sa;
	nni_plat_udp_sockname(ep->udp, &sa);
	url->u_port = nng_sockaddr_port(&sa);
	udp_ep_start(ep);
	nni_mtx_unlock(&ep->mtx);

	return (rv);
}